

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  ulong uVar1;
  uchar uVar2;
  byte bVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  cJSON_bool cVar9;
  lconv *plVar10;
  long lVar11;
  cJSON_bool cVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  double dVar16;
  uchar *after_end;
  byte *local_80;
  byte local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar12 = 0;
  cVar9 = 0;
  if ((input_buffer != (parse_buffer *)0x0) &&
     (puVar4 = input_buffer->content, cVar9 = cVar12, puVar4 != (uchar *)0x0)) {
    uVar5 = input_buffer->length;
    uVar6 = input_buffer->offset;
    uVar1 = uVar6 + 4;
    if ((uVar5 < uVar1) || (iVar8 = strncmp((char *)(puVar4 + uVar6),"null",4), iVar8 != 0)) {
      uVar15 = uVar6 + 5;
      if ((uVar5 < uVar15) || (iVar8 = strncmp((char *)(puVar4 + uVar6),"false",5), iVar8 != 0)) {
        if ((uVar5 < uVar1) || (iVar8 = strncmp((char *)(puVar4 + uVar6),"true",4), iVar8 != 0)) {
          if (uVar6 < uVar5) {
            uVar2 = puVar4[uVar6];
            if (uVar2 == '\"') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                cVar9 = parse_string(item,input_buffer);
                return cVar9;
              }
              goto LAB_0010283d;
            }
            if (uVar2 == '-' || (byte)(uVar2 - 0x30) < 10) {
              local_80 = (byte *)0x0;
              plVar10 = localeconv();
              puVar4 = input_buffer->content;
              if (puVar4 != (uchar *)0x0) {
                bVar3 = *plVar10->decimal_point;
                uVar1 = input_buffer->length;
                sVar7 = input_buffer->offset;
                lVar11 = 0;
                do {
                  if ((uVar1 <= sVar7 + lVar11) ||
                     ((bVar13 = puVar4[lVar11 + sVar7], 9 < bVar13 - 0x30 &&
                      ((uVar14 = bVar13 - 0x2b, 0x3a < uVar14 ||
                       (((0x400000004000005U >> ((ulong)uVar14 & 0x3f) & 1) == 0 &&
                        (bVar13 = bVar3, (ulong)uVar14 != 3)))))))) goto LAB_001027cd;
                  local_78[lVar11] = bVar13;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 0x3f);
                lVar11 = 0x3f;
LAB_001027cd:
                local_78[lVar11] = 0;
                dVar16 = strtod((char *)local_78,(char **)&local_80);
                if (local_78 != local_80) {
                  item->valuedouble = dVar16;
                  iVar8 = 0x7fffffff;
                  if ((dVar16 < 2147483647.0) && (iVar8 = -0x80000000, -2147483648.0 < dVar16)) {
                    iVar8 = (int)dVar16;
                  }
                  item->valueint = iVar8;
                  item->type = 8;
                  input_buffer->offset =
                       (size_t)(local_80 + (input_buffer->offset - (long)local_78));
                  goto LAB_00102740;
                }
              }
              cVar9 = 0;
            }
            else {
              if (uVar2 == '{') {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  cVar9 = parse_object(item,input_buffer);
                  return cVar9;
                }
                goto LAB_0010283d;
              }
              if (uVar2 == '[') {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  cVar9 = parse_array(item,input_buffer);
                  return cVar9;
                }
                goto LAB_0010283d;
              }
            }
          }
          goto LAB_00102745;
        }
        item->type = 2;
        item->valueint = 1;
        uVar15 = uVar1;
      }
      else {
        item->type = 1;
      }
      input_buffer->offset = uVar15;
    }
    else {
      item->type = 4;
      input_buffer->offset = uVar1;
    }
LAB_00102740:
    cVar9 = 1;
  }
LAB_00102745:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar9;
  }
LAB_0010283d:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }


    return false;
}